

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cpp.cpp
# Opt level: O1

void __thiscall spirv_cross::CompilerCPP::emit_block_struct(CompilerCPP *this,SPIRType *type)

{
  SPIRType *type_00;
  
  type_00 = Variant::get<spirv_cross::SPIRType>
                      ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                       super_VectorView<spirv_cross::Variant>.ptr + (type->super_IVariant).self.id);
  (type_00->type_alias).id = 0;
  CompilerGLSL::emit_struct(&this->super_CompilerGLSL,type_00);
  return;
}

Assistant:

void CompilerCPP::emit_block_struct(SPIRType &type)
{
	// C++ can't do interface blocks, so we fake it by emitting a separate struct.
	// However, these structs are not allowed to alias anything, so remove it before
	// emitting the struct.
	//
	// The type we have here needs to be resolved to the non-pointer type so we can remove aliases.
	auto &self = get<SPIRType>(type.self);
	self.type_alias = 0;
	emit_struct(self);
}